

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<char16_t>::relocate
          (QArrayDataPointer<char16_t> *this,qsizetype offset,char16_t **data)

{
  char16_t *d_first;
  char16_t *pcVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<char16_t,long_long>(this->ptr,this->size,d_first);
  if (data != (char16_t **)0x0) {
    pcVar1 = *data;
    if ((this->ptr <= pcVar1) && (pcVar1 < this->ptr + this->size)) {
      *data = pcVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }